

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O2

Output * __thiscall ftxui::TerminalInputParser::ParseDCS(TerminalInputParser *this)

{
  int iVar1;
  pointer pcVar2;
  Output *in_RDI;
  ulong uVar3;
  Type TVar4;
  int iVar5;
  ulong uVar6;
  
  iVar1 = (int)(this->pending_)._M_string_length;
  uVar6 = (ulong)(uint)this->position_;
  pcVar2 = (this->pending_)._M_dataplus._M_p;
  TVar4 = UNCOMPLETED;
  do {
    do {
      iVar5 = (int)uVar6;
      uVar6 = (long)iVar5 + 1;
      this->position_ = (int)uVar6;
      if (iVar1 <= (int)uVar6) goto LAB_0013c45d;
    } while (pcVar2[uVar6] != '\x1b');
    uVar3 = (long)iVar5 + 2;
    this->position_ = (int)uVar3;
    if (iVar1 <= (int)uVar3) goto LAB_0013c45d;
    uVar6 = uVar3 & 0xffffffff;
  } while (pcVar2[uVar3] != '\\');
  TVar4 = SPECIAL;
LAB_0013c45d:
  in_RDI->type = TVar4;
  return in_RDI;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseDCS() {
  // Parse until the string terminator ST.
  while (1) {
    if (!Eat())
      return UNCOMPLETED;

    if (Current() != '\x1B')
      continue;

    if (!Eat())
      return UNCOMPLETED;

    if (Current() != '\\')
      continue;

    return SPECIAL;
  }
}